

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

ostream * MinVR::operator<<(ostream *os,VRDatum_conflict *p)

{
  ostream *poVar1;
  long *in_RSI;
  ostream *in_RDI;
  string local_30 [48];
  
  (**(code **)(*in_RSI + 0x10))();
  poVar1 = std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream &os, const VRDatum& p) {
  return os << p.getValueString();
}